

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataQueue.cpp
# Opt level: O1

void __thiscall MinVR::VRDataQueue::addQueue(VRDataQueue *this,VRDataQueue *newQueue)

{
  longlong timeStamp;
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  _Self __tmp;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if ((newQueue->_dataMap)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    p_Var1 = (newQueue->_dataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var2 = &(newQueue->_dataMap)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var1 != p_Var2) {
      do {
        timeStamp = *(longlong *)(p_Var1 + 1);
        local_58 = (undefined1  [8])p_Var1[1]._M_left;
        local_50._M_p = (pointer)&local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,p_Var1[1]._M_right,
                   (long)&(p_Var1[1]._M_right)->_M_color + *(long *)(p_Var1 + 2));
        push(this,timeStamp,(VRDataQueueItem *)local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_p != &local_40) {
          operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
        }
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
      } while ((_Rb_tree_header *)p_Var1 != p_Var2);
    }
  }
  return;
}

Assistant:

VRDataQueue::serialData VRDataQueue::serialize() {

  std::ostringstream lenStr;
  lenStr << _dataMap.size();

  VRDataQueue::serialData out;

  out = "<VRDataQueue num=\"" + lenStr.str() + "\">";
  for (VRDataList::iterator it = _dataMap.begin(); it != _dataMap.end(); ++it) {
    std::ostringstream timeStamp;
    timeStamp << it->first.first << "-" << std::setfill('0') << std::setw(3) << it->first.second;
    out += "<VRDataQueueItem timeStamp=\"" + timeStamp.str() + "\">" +
      it->second.serialize() + "</VRDataQueueItem>";
  }
  out += "</VRDataQueue>";

  return out;
}